

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReader::ReadTable
          (BinaryReader *this,Type *out_elem_type,Limits *out_elem_limits)

{
  bool bVar1;
  bool bVar2;
  Result RVar3;
  bool is_shared;
  bool has_max;
  uint32_t local_38;
  uint local_34;
  uint32_t max;
  uint32_t initial;
  uint32_t flags;
  Limits *out_elem_limits_local;
  Type *out_elem_type_local;
  BinaryReader *this_local;
  
  _flags = out_elem_limits;
  out_elem_limits_local = (Limits *)out_elem_type;
  out_elem_type_local = (Type *)this;
  initial = (uint32_t)ReadType(this,out_elem_type,"table elem type");
  bVar1 = Failed((Result)initial);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = Type::IsRef((Type *)out_elem_limits_local);
    if (bVar1) {
      local_38 = 0;
      RVar3 = ReadU32Leb128(this,&max,"table flags");
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        RVar3 = ReadU32Leb128(this,&local_34,"table initial elem count");
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          bVar1 = (max & 1) != 0;
          if ((max & 2) == 0) {
            if (bVar1) {
              RVar3 = ReadU32Leb128(this,&local_38,"table max elem count");
              bVar2 = Failed(RVar3);
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            _flags->has_max = bVar1;
            _flags->initial = (ulong)local_34;
            _flags->max = (ulong)local_38;
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
          else {
            PrintError(this,"tables may not be shared");
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
      }
    }
    else {
      PrintError(this,"table elem type must be a reference type");
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadTable(Type* out_elem_type, Limits* out_elem_limits) {
  CHECK_RESULT(ReadType(out_elem_type, "table elem type"));
  ERROR_UNLESS(out_elem_type->IsRef(),
               "table elem type must be a reference type");

  uint32_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU32Leb128(&flags, "table flags"));
  CHECK_RESULT(ReadU32Leb128(&initial, "table initial elem count"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  ERROR_IF(is_shared, "tables may not be shared");
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "table max elem count"));
  }

  out_elem_limits->has_max = has_max;
  out_elem_limits->initial = initial;
  out_elem_limits->max = max;
  return Result::Ok;
}